

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_parser_extras.cpp
# Opt level: O3

void __thiscall ast_compound_statement::print(ast_compound_statement *this)

{
  exec_node *peVar1;
  exec_node **ppeVar2;
  
  puts("{");
  peVar1 = (this->statements).head_sentinel.next;
  ppeVar2 = &peVar1[-3].prev;
  if (ppeVar2 != (exec_node **)0x0 && peVar1->next != (exec_node *)0x0) {
    do {
      (*(code *)(*ppeVar2)->next)(ppeVar2);
      if (*(long *)ppeVar2[5] == 0) break;
      ppeVar2 = (exec_node **)((long)ppeVar2[5] + -0x28);
    } while (ppeVar2 != (exec_node **)0x0);
  }
  puts("}");
  return;
}

Assistant:

void
ast_compound_statement::print(void) const
{
   printf("{\n");

   foreach_list_typed(ast_node, ast, link, &this->statements) {
      ast->print();
   }

   printf("}\n");
}